

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

int __thiscall CChat::GetChatSound(CChat *this,int ChatType)

{
  int iVar1;
  
  iVar1 = -1;
  if ((uint)ChatType < 3) {
    iVar1 = *(int *)(&DAT_001db24c + (ulong)(uint)ChatType * 4);
  }
  return iVar1;
}

Assistant:

int CChat::GetChatSound(int ChatType)
{
	switch(ChatType)
	{
		case CHAT_SERVER: return SOUND_CHAT_SERVER;
		case CHAT_HIGHLIGHT: return SOUND_CHAT_HIGHLIGHT;
		case CHAT_CLIENT: return SOUND_CHAT_CLIENT;
		default: return -1;
	}
}